

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O0

void d68000_movem_re_32(void)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  bool bVar4;
  uint local_44;
  int local_40;
  uint i;
  uint run_length;
  uint first;
  char buffer [40];
  uint data;
  
  buffer._36_4_ = dasm_read_imm_16(2);
  run_length._0_1_ = '\0';
  for (local_44 = 0; uVar1 = local_44, local_44 < 8; local_44 = local_44 + 1) {
    if ((buffer._36_4_ & 1 << ((byte)local_44 & 0x1f)) != 0) {
      local_40 = 0;
      while( true ) {
        bVar4 = false;
        if (local_44 < 7) {
          bVar4 = (buffer._36_4_ & 1 << ((char)local_44 + 1U & 0x1f)) != 0;
        }
        if (!bVar4) break;
        local_44 = local_44 + 1;
        local_40 = local_40 + 1;
      }
      if ((char)run_length != '\0') {
        strcat((char *)&run_length,"/");
      }
      sVar2 = strlen((char *)&run_length);
      sprintf((char *)((long)&run_length + sVar2),"D%d",(ulong)uVar1);
      if (local_40 != 0) {
        sVar2 = strlen((char *)&run_length);
        sprintf((char *)((long)&run_length + sVar2),"-D%d",(ulong)(uVar1 + local_40));
      }
    }
  }
  for (local_44 = 0; uVar1 = local_44, local_44 < 8; local_44 = local_44 + 1) {
    if ((buffer._36_4_ & 1 << ((char)local_44 + 8U & 0x1f)) != 0) {
      local_40 = 0;
      while( true ) {
        bVar4 = false;
        if (local_44 < 7) {
          bVar4 = (buffer._36_4_ & 1 << ((char)local_44 + 9U & 0x1f)) != 0;
        }
        if (!bVar4) break;
        local_44 = local_44 + 1;
        local_40 = local_40 + 1;
      }
      if ((char)run_length != '\0') {
        strcat((char *)&run_length,"/");
      }
      sVar2 = strlen((char *)&run_length);
      sprintf((char *)((long)&run_length + sVar2),"A%d",(ulong)uVar1);
      if (local_40 != 0) {
        sVar2 = strlen((char *)&run_length);
        sprintf((char *)((long)&run_length + sVar2),"-A%d",(ulong)(uVar1 + local_40));
      }
    }
  }
  pcVar3 = get_ea_mode_str(g_cpu_ir,2);
  sprintf(g_dasm_str,"movem.l %s, %s",&run_length,pcVar3);
  return;
}

Assistant:

static void d68000_movem_re_32(void)
{
	uint data = read_imm_16();
	char buffer[40];
	uint first;
	uint run_length;
	uint i;

	buffer[0] = 0;
	for(i=0;i<8;i++)
	{
		if(data&(1<<i))
		{
			first = i;
			run_length = 0;
			while(i<7 && (data&(1<<(i+1))))
			{
				i++;
				run_length++;
			}
			if(buffer[0] != 0)
				strcat(buffer, "/");
			sprintf(buffer+strlen(buffer), "D%d", first);
			if(run_length > 0)
				sprintf(buffer+strlen(buffer), "-D%d", first + run_length);
		}
	}
	for(i=0;i<8;i++)
	{
		if(data&(1<<(i+8)))
		{
			first = i;
			run_length = 0;
			while(i<7 && (data&(1<<(i+8+1))))
			{
				i++;
				run_length++;
			}
			if(buffer[0] != 0)
				strcat(buffer, "/");
			sprintf(buffer+strlen(buffer), "A%d", first);
			if(run_length > 0)
				sprintf(buffer+strlen(buffer), "-A%d", first + run_length);
		}
	}
	sprintf(g_dasm_str, "movem.l %s, %s", buffer, get_ea_mode_str_32(g_cpu_ir));
}